

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_core.c
# Opt level: O0

BIO * BIO_new_from_core_bio(OSSL_LIB_CTX *libctx,OSSL_CORE_BIO *corebio)

{
  int iVar1;
  OSSL_LIB_CTX *libctx_00;
  void *in_RSI;
  BIO_METHOD *in_RDI;
  BIO_CORE_GLOBALS *bcgbl;
  BIO *outbio;
  BIO *local_8;
  
  libctx_00 = (OSSL_LIB_CTX *)get_globals((OSSL_LIB_CTX *)0x390ff8);
  if (((libctx_00->data).ctx == (OSSL_LIB_CTX *)0x0) &&
     ((OSSL_FUNC_BIO_read_ex_fn *)libctx_00->lock == (OSSL_FUNC_BIO_read_ex_fn *)0x0)) {
    local_8 = (BIO *)0x0;
  }
  else {
    BIO_s_core();
    local_8 = BIO_new_ex(libctx_00,in_RDI);
    if (local_8 == (BIO *)0x0) {
      local_8 = (BIO *)0x0;
    }
    else {
      iVar1 = (*(code *)(libctx_00->global).ex_data[1].meth)(in_RSI);
      if (iVar1 == 0) {
        BIO_free((BIO *)local_8);
        local_8 = (BIO *)0x0;
      }
      else {
        BIO_set_data(local_8,in_RSI);
      }
    }
  }
  return local_8;
}

Assistant:

BIO *BIO_new_from_core_bio(OSSL_LIB_CTX *libctx, OSSL_CORE_BIO *corebio)
{
    BIO *outbio;
    BIO_CORE_GLOBALS *bcgbl = get_globals(libctx);

    /* Check the library context has been initialised with the callbacks */
    if (bcgbl->c_bio_write_ex == NULL && bcgbl->c_bio_read_ex == NULL)
        return NULL;

    if ((outbio = BIO_new_ex(libctx, BIO_s_core())) == NULL)
        return NULL;

    if (!bcgbl->c_bio_up_ref(corebio)) {
        BIO_free(outbio);
        return NULL;
    }
    BIO_set_data(outbio, corebio);
    return outbio;
}